

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SubroutineSymbols.cpp
# Opt level: O3

MethodPrototypeSymbol *
slang::ast::MethodPrototypeSymbol::fromSyntax
          (Scope *scope,ModportSubroutinePortSyntax *syntax,bool isExport)

{
  undefined1 *puVar1;
  char *pcVar2;
  TokenKind TVar3;
  Compilation *dst;
  FunctionPrototypeSyntax *pFVar4;
  bitmask<slang::ast::MethodFlags> bVar5;
  int iVar6;
  MethodPrototypeSymbol *pMVar7;
  undefined4 extraout_var;
  undefined7 in_register_00000011;
  FunctionPortListSyntax *extraout_RDX;
  FunctionPortListSyntax *syntax_00;
  size_t extraout_RDX_00;
  undefined1 in_R9B;
  Token TVar8;
  Token nameToken;
  SmallVector<const_slang::ast::FormalArgumentSymbol_*,_5UL> arguments;
  SmallVectorBase<const_slang::ast::FormalArgumentSymbol_*> local_68 [2];
  
  dst = scope->compilation;
  pFVar4 = (syntax->prototype).ptr;
  TVar8 = slang::syntax::SyntaxNode::getLastToken((SyntaxNode *)(pFVar4->name).ptr);
  nameToken.info = (Info *)(CONCAT71(in_register_00000011,isExport) & 0xffffffff);
  nameToken._0_8_ = TVar8.info;
  pMVar7 = createForModport((MethodPrototypeSymbol *)scope,(Scope *)syntax,TVar8._0_8_,nameToken,
                            (bool)in_R9B);
  if ((pMVar7->subroutine).super__Optional_base<const_slang::ast::SubroutineSymbol_*,_true,_true>.
      _M_payload.super__Optional_payload_base<const_slang::ast::SubroutineSymbol_*>._M_engaged !=
      false) {
    if ((pMVar7->subroutine).super__Optional_base<const_slang::ast::SubroutineSymbol_*,_true,_true>.
        _M_payload.super__Optional_payload_base<const_slang::ast::SubroutineSymbol_*>._M_payload.
        _M_value != (SubroutineSymbol *)0x0) {
      TVar3 = (pFVar4->keyword).kind;
      pMVar7->subroutineKind = (uint)(TVar3 == TaskKeyword);
      if (TVar3 == TaskKeyword) {
        (pMVar7->declaredReturnType).type = dst->voidType;
      }
      else {
        (pMVar7->declaredReturnType).typeOrLink =
             (anon_union_8_2_f12d5f64_for_typeOrLink)(pFVar4->returnType).ptr;
        puVar1 = &(pMVar7->declaredReturnType).field_0x3f;
        *puVar1 = *puVar1 & 0x7f;
      }
      pcVar2 = local_68[0].firstElement;
      local_68[0].len = 0;
      local_68[0].cap = 5;
      syntax_00 = pFVar4->portList;
      local_68[0].data_ = (pointer)pcVar2;
      if (syntax_00 != (FunctionPortListSyntax *)0x0) {
        bVar5 = SubroutineSymbol::buildArguments
                          (&pMVar7->super_Scope,scope,syntax_00,Automatic,local_68);
        (pMVar7->flags).m_bits = (pMVar7->flags).m_bits | bVar5.m_bits;
        syntax_00 = extraout_RDX;
      }
      iVar6 = SmallVectorBase<const_slang::ast::FormalArgumentSymbol_*>::copy
                        (local_68,(EVP_PKEY_CTX *)dst,(EVP_PKEY_CTX *)syntax_00);
      (pMVar7->arguments)._M_ptr = (pointer)CONCAT44(extraout_var,iVar6);
      (pMVar7->arguments)._M_extent._M_extent_value = extraout_RDX_00;
      pMVar7->needsMatchCheck = true;
      if (local_68[0].data_ != (pointer)pcVar2) {
        operator_delete(local_68[0].data_);
      }
    }
    return pMVar7;
  }
  std::__throw_bad_optional_access();
}

Assistant:

MethodPrototypeSymbol& MethodPrototypeSymbol::fromSyntax(const Scope& scope,
                                                         const ModportSubroutinePortSyntax& syntax,
                                                         bool isExport) {
    auto& comp = scope.getCompilation();
    auto& proto = *syntax.prototype;
    auto& result = createForModport(scope, syntax, syntax.prototype->name->getLastToken(),
                                    isExport);

    auto target = result.subroutine.value();
    if (!target)
        return result;

    result.subroutineKind = proto.keyword.kind == TokenKind::TaskKeyword ? SubroutineKind::Task
                                                                         : SubroutineKind::Function;

    if (result.subroutineKind == SubroutineKind::Function)
        result.declaredReturnType.setTypeSyntax(*proto.returnType);
    else
        result.declaredReturnType.setType(comp.getVoidType());

    SmallVector<const FormalArgumentSymbol*> arguments;
    if (proto.portList) {
        result.flags |= SubroutineSymbol::buildArguments(result, scope, *proto.portList,
                                                         VariableLifetime::Automatic, arguments);
    }

    result.arguments = arguments.copy(comp);
    result.needsMatchCheck = true;
    return result;
}